

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_crypto_tests.cpp
# Opt level: O0

void wallet::wallet_crypto_tests::TestCrypter::TestPassphraseSingle
               (span<const_unsigned_char,_18446744073709551615UL> salt,SecureString *passphrase,
               uint32_t rounds,span<const_unsigned_char,_18446744073709551615UL> correct_key,
               span<const_unsigned_char,_18446744073709551615UL> correct_iv)

{
  span<const_unsigned_char,_18446744073709551615UL> salt_00;
  Span<const_unsigned_char> s;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> s_02;
  bool bVar1;
  uchar *__s1;
  pointer __s2;
  size_type sVar2;
  long in_FS_OFFSET;
  CCrypter crypt;
  CCrypter *in_stack_fffffffffffffc78;
  undefined7 in_stack_fffffffffffffc80;
  undefined1 in_stack_fffffffffffffc87;
  undefined7 in_stack_fffffffffffffc88;
  undefined1 in_stack_fffffffffffffc8f;
  const_string *in_stack_fffffffffffffca0;
  CCrypter *in_stack_fffffffffffffca8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  allocator<char> *in_stack_fffffffffffffcb8;
  allocator<char> *__a;
  uint in_stack_fffffffffffffcc0;
  uint in_stack_fffffffffffffcc4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc8;
  CCrypter *in_stack_fffffffffffffcd0;
  pointer in_stack_fffffffffffffcf0;
  __extent_storage<18446744073709551615UL> _Var3;
  uchar *puVar4;
  size_t in_stack_fffffffffffffd08;
  const_string local_2d8 [2];
  allocator<char> local_2b1 [17];
  lazy_ostream local_2a0 [2];
  const_string local_248 [2];
  undefined1 local_221 [49];
  uchar local_180 [24];
  const_string local_168 [22];
  long local_8;
  
  _Var3._M_extent_value = (size_t)&stack0x00000008;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  puVar4 = local_180;
  CCrypter::CCrypter(in_stack_fffffffffffffca8);
  salt_00._M_extent._M_extent_value = _Var3._M_extent_value;
  salt_00._M_ptr = in_stack_fffffffffffffcf0;
  CCrypter::SetKeyFromPassphrase
            (in_stack_fffffffffffffcd0,(SecureString *)in_stack_fffffffffffffcc8,salt_00,
             in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0);
  bVar1 = std::span<const_unsigned_char,_18446744073709551615UL>::empty
                    ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffc78)
  ;
  if (!bVar1) {
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                 (pointer)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (unsigned_long)in_stack_fffffffffffffc78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc78);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffcb8,
                 (const_string *)in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8,
                 in_stack_fffffffffffffca0);
      __s1 = std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
                       (&in_stack_fffffffffffffc78->vchKey);
      __s2 = std::span<const_unsigned_char,_18446744073709551615UL>::data
                       ((span<const_unsigned_char,_18446744073709551615UL> *)
                        in_stack_fffffffffffffc78);
      sVar2 = std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::size
                        (&in_stack_fffffffffffffc78->vchKey);
      memcmp(__s1,__s2,sVar2);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                 (bool)in_stack_fffffffffffffc87);
      boost::unit_test::lazy_ostream::instance();
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,secure_allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)
                 CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                 (vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 in_stack_fffffffffffffc78);
      s.m_size = in_stack_fffffffffffffd08;
      s.m_data = puVar4;
      HexStr_abi_cxx11_(s);
      in_stack_fffffffffffffcc8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_221;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffcc8,
                 (char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                 in_stack_fffffffffffffcb8);
      std::operator+(in_stack_fffffffffffffcb0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffca8);
      Span<unsigned_char_const>::Span<std::span<unsigned_char_const,18446744073709551615ul>>
                ((Span<const_unsigned_char> *)
                 CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                 (span<const_unsigned_char,_18446744073709551615UL> *)
                 CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 in_stack_fffffffffffffc78);
      s_00.m_size = in_stack_fffffffffffffd08;
      s_00.m_data = puVar4;
      HexStr_abi_cxx11_(s_00);
      std::operator+(in_stack_fffffffffffffcb0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffca8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                 (pointer)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (unsigned_long)in_stack_fffffffffffffc78);
      in_stack_fffffffffffffc78 = (CCrypter *)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&stack0xfffffffffffffe10,(lazy_ostream *)(local_221 + 0x11),
                 local_248,0x1f,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffffc78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc78);
      std::allocator<char>::~allocator((allocator<char> *)local_221);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc78);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffc78);
      bVar1 = boost::test_tools::tt_detail::dummy_cond();
      in_stack_fffffffffffffcc4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffcc4);
    } while (bVar1);
  }
  bVar1 = std::span<const_unsigned_char,_18446744073709551615UL>::empty
                    ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffc78)
  ;
  if (!bVar1) {
    do {
      __a = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                 (pointer)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (unsigned_long)in_stack_fffffffffffffc78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffc78);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)__a,(const_string *)in_stack_fffffffffffffcb0,
                 (size_t)in_stack_fffffffffffffca8,in_stack_fffffffffffffca0);
      in_stack_fffffffffffffca0 = local_168;
      in_stack_fffffffffffffca8 =
           (CCrypter *)
           std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::data
                     (&in_stack_fffffffffffffc78->vchKey);
      in_stack_fffffffffffffcb0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::span<const_unsigned_char,_18446744073709551615UL>::data
                     ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffc78
                     );
      sVar2 = std::vector<unsigned_char,_secure_allocator<unsigned_char>_>::size
                        (&in_stack_fffffffffffffc78->vchKey);
      memcmp(in_stack_fffffffffffffca8,in_stack_fffffffffffffcb0,sVar2);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                 (bool)in_stack_fffffffffffffc87);
      boost::unit_test::lazy_ostream::instance();
      Span<unsigned_char_const>::Span<std::vector<unsigned_char,secure_allocator<unsigned_char>>>
                ((Span<const_unsigned_char> *)
                 CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                 (vector<unsigned_char,_secure_allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 in_stack_fffffffffffffc78);
      s_01.m_size = in_stack_fffffffffffffd08;
      s_01.m_data = puVar4;
      HexStr_abi_cxx11_(s_01);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffcc8,
                 (char *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),__a);
      std::operator+(in_stack_fffffffffffffcb0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffca8);
      Span<unsigned_char_const>::Span<std::span<unsigned_char_const,18446744073709551615ul>>
                ((Span<const_unsigned_char> *)
                 CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                 (span<const_unsigned_char,_18446744073709551615UL> *)
                 CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 in_stack_fffffffffffffc78);
      s_02.m_size = in_stack_fffffffffffffd08;
      s_02.m_data = puVar4;
      HexStr_abi_cxx11_(s_02);
      std::operator+(in_stack_fffffffffffffcb0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffca8);
      boost::unit_test::operator<<
                ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc78);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)
                 CONCAT17(in_stack_fffffffffffffc8f,in_stack_fffffffffffffc88),
                 (pointer)CONCAT17(in_stack_fffffffffffffc87,in_stack_fffffffffffffc80),
                 (unsigned_long)in_stack_fffffffffffffc78);
      in_stack_fffffffffffffc78 = (CCrypter *)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&stack0xfffffffffffffd80,local_2a0,local_2d8,0x23,CHECK);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                  *)in_stack_fffffffffffffc78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc78);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc78);
      std::allocator<char>::~allocator(local_2b1);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffc78);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffc78);
      in_stack_fffffffffffffc8f = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffc8f);
  }
  CCrypter::~CCrypter(in_stack_fffffffffffffc78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void TestPassphraseSingle(const std::span<const unsigned char> salt, const SecureString& passphrase, uint32_t rounds,
                                 const std::span<const unsigned char> correct_key = {},
                                 const std::span<const unsigned char> correct_iv = {})
{
    CCrypter crypt;
    crypt.SetKeyFromPassphrase(passphrase, salt, rounds, 0);

    if (!correct_key.empty()) {
        BOOST_CHECK_MESSAGE(memcmp(crypt.vchKey.data(), correct_key.data(), crypt.vchKey.size()) == 0,
            HexStr(crypt.vchKey) + std::string(" != ") + HexStr(correct_key));
    }
    if (!correct_iv.empty()) {
        BOOST_CHECK_MESSAGE(memcmp(crypt.vchIV.data(), correct_iv.data(), crypt.vchIV.size()) == 0,
            HexStr(crypt.vchIV) + std::string(" != ") + HexStr(correct_iv));
    }
}